

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O3

bool ImNodes::GetPendingConnection(void **node_id,char **slot_title,int *slot_kind)

{
  undefined8 *puVar1;
  int iVar2;
  ImGuiPayload *pIVar3;
  
  if (gCanvas == 0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x241,"bool ImNodes::GetPendingConnection(void **, const char **, int *)");
  }
  if (node_id == (void **)0x0) {
    __assert_fail("node_id != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x242,"bool ImNodes::GetPendingConnection(void **, const char **, int *)");
  }
  if (slot_title == (char **)0x0) {
    __assert_fail("slot_title != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x243,"bool ImNodes::GetPendingConnection(void **, const char **, int *)");
  }
  if (slot_kind != (int *)0x0) {
    pIVar3 = ImGui::GetDragDropPayload();
    if ((pIVar3 != (ImGuiPayload *)0x0) &&
       (iVar2 = strncmp("new-node-connection-",pIVar3->DataType,0x14), iVar2 == 0)) {
      puVar1 = (undefined8 *)pIVar3->Data;
      *node_id = (void *)*puVar1;
      *slot_title = (char *)puVar1[1];
      *slot_kind = *(int *)(puVar1 + 2);
      return true;
    }
    return false;
  }
  __assert_fail("slot_kind != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                ,0x244,"bool ImNodes::GetPendingConnection(void **, const char **, int *)");
}

Assistant:

bool GetPendingConnection(void** node_id, const char** slot_title, int* slot_kind)
{
    assert(gCanvas != nullptr);
    assert(node_id != nullptr);
    assert(slot_title != nullptr);
    assert(slot_kind != nullptr);

    if (auto* payload = ImGui::GetDragDropPayload())
    {
        char drag_id[] = "new-node-connection-";
        if (strncmp(drag_id, payload->DataType, sizeof(drag_id) - 1) == 0)
        {
            auto* drag_payload = (_DragConnectionPayload*)payload->Data;
            *node_id = drag_payload->node_id;
            *slot_title = drag_payload->slot_title;
            *slot_kind = drag_payload->slot_kind;
            return true;
        }
    }

    return false;
}